

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O0

void cmCMakePresetsErrors::CYCLIC_PRESET_INHERITANCE(string *presetName,cmJSONState *state)

{
  string local_38;
  cmJSONState *local_18;
  cmJSONState *state_local;
  string *presetName_local;
  
  local_18 = state;
  state_local = (cmJSONState *)presetName;
  cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[2]>
            (&local_38,(char (*) [39])"Cyclic preset inheritance for preset \"",presetName,
             (char (*) [2])0x1031a6f);
  cmJSONState::AddError(state,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void CYCLIC_PRESET_INHERITANCE(const std::string& presetName,
                               cmJSONState* state)

{
  state->AddError(
    cmStrCat("Cyclic preset inheritance for preset \"", presetName, "\""));
}